

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void arm_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  CPUArchState_conflict1 *env;
  target_ulong tVar1;
  abi_ptr addr;
  ulong uVar2;
  long lVar3;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var4;
  DisasJumpType DVar5;
  int iVar6;
  undefined1 *puVar7;
  DisasJumpType insn;
  arg_SB *a;
  uint32_t target_el;
  uint uVar8;
  TCGContext_conflict1 *tcg_ctx;
  bool bVar9;
  arg_CPS local_38;
  
  env = (CPUArchState_conflict1 *)cpu->env_ptr;
  _Var4 = arm_pre_translate_insn((DisasContext_conflict1 *)dcbase);
  if (_Var4) {
    return;
  }
  local_38._0_8_ = dcbase->pc_next;
  tVar1 = dcbase[8].pc_next;
  if (*(int *)(tVar1 + 0x57c) == 0) {
    bVar9 = *(target_ulong *)(tVar1 + 0x578 + (long)*(int *)(tVar1 + 0x39e0) * 8) == local_38._0_8_;
  }
  else {
    puVar7 = (undefined1 *)g_tree_lookup(*(GTree **)(tVar1 + 0x780),&local_38);
    bVar9 = puVar7 == &DAT_00000001;
  }
  if (bVar9) {
LAB_006419e6:
    dcbase->is_jmp = DISAS_TARGET_2;
    return;
  }
  addr = dcbase->pc_next;
  dcbase[1].pc_first = addr;
  iVar6 = *(int *)((long)&dcbase[2].pc_first + 4);
  DVar5 = cpu_ldl_code_aarch64(env,addr);
  insn = DVar5 >> 0x18 | (DVar5 & 0xff0000) >> 8 | (DVar5 & 0xff00) << 8 | DVar5 << 0x18;
  if (iVar6 == 0) {
    insn = DVar5;
  }
  dcbase[1].is_jmp = insn;
  tVar1 = dcbase[8].pc_next;
  if (*(int *)(tVar1 + 0x578) != 0) goto LAB_006419e6;
  dcbase->pc_next = dcbase->pc_next + 4;
  if ((dcbase[4].pc_first & 0x200) != 0) {
    if ((dcbase[2].is_jmp != 0x17) || (target_el = 3, *(char *)((long)&dcbase[3].tb + 4) == '\0')) {
      target_el = 1;
      if (1 < dcbase[3].max_insns) {
        target_el = dcbase[3].max_insns;
      }
    }
    gen_exception_insn((DisasContext_conflict1 *)dcbase,(uint32_t)dcbase[1].pc_first,0x12,0x2000000,
                       target_el);
    goto LAB_00641be9;
  }
  uVar2 = dcbase[1].pc_first;
  for (a = *(arg_SB **)(tVar1 + 0x358); a != (arg_SB *)0x0; a = *(arg_SB **)a) {
    lVar3 = *(long *)(a + 8);
    if ((((*(ulong *)(lVar3 + 0x18) <= uVar2) && (uVar2 <= *(ulong *)(lVar3 + 0x20))) ||
        (*(ulong *)(lVar3 + 0x20) < *(ulong *)(lVar3 + 0x18))) &&
       (*(char *)(lVar3 + 0x14) != '\x01')) break;
  }
  uVar8 = insn >> 0x1c;
  if (a != (arg_SB *)0x0) {
    tcg_ctx_00 = *(TCGContext_conflict1 **)(tVar1 + 0x2e8);
    tcg_gen_op2_aarch64(tcg_ctx_00,INDEX_op_movi_i32,
                        (TCGArg)(tcg_ctx_00->cpu_R[0xf] + (long)tcg_ctx_00),(long)(int)uVar2);
    a = (arg_SB *)0x4;
    gen_uc_tracecode(tcg_ctx_00,4,2,(void *)dcbase[8].pc_next,dcbase[1].pc_first);
    check_exit_request_aarch64(tcg_ctx_00);
  }
  if (uVar8 == 0xe) {
LAB_00641b99:
    _Var4 = disas_a32((DisasContext_conflict1 *)dcbase,insn);
    if ((_Var4) || (_Var4 = disas_vfp((DisasContext_conflict1 *)dcbase,insn), _Var4))
    goto LAB_00641be9;
    if (((insn & 0xe00) == 0xa00) || ((insn >> 0x18 & 0xf) - 0xf < 0xfffffffd)) goto LAB_00641be1;
    iVar6 = disas_coproc_insn((DisasContext_conflict1 *)dcbase,insn);
    goto LAB_00641bdd;
  }
  if (uVar8 != 0xf) {
    arm_skip_unless((DisasContext_conflict1 *)dcbase,uVar8);
    goto LAB_00641b99;
  }
  uVar2 = dcbase[4].pc_first;
  if (-1 < (short)uVar2) goto LAB_00641be1;
  switch(insn >> 0x19) {
  case 0x78:
    if ((insn & 0x1f1fc20) == 0x1010000) {
      local_38._0_8_ = CONCAT44(local_38.F,insn >> 9) & 0xffffffff00000001;
      if ((insn & 0xe01df) == DISAS_NEXT) {
        _Var4 = trans_SETEND((DisasContext_conflict1 *)dcbase,(arg_SETEND *)&local_38);
        goto LAB_00641d03;
      }
    }
    else if ((insn & 0x1f1fc20) == 0x1000000) {
      local_38.imod = insn >> 0x12 & 3;
      local_38.M = insn >> 0x11 & 1;
      local_38.I = insn >> 7 & 1;
      local_38._0_8_ = CONCAT44(insn >> 6,insn >> 8) & 0x100000001;
      local_38.mode = insn & 0x1f;
      if ((insn >> 9 & 1) == 0) {
        _Var4 = trans_CPS((DisasContext_conflict1 *)dcbase,&local_38);
        goto LAB_00641d03;
      }
    }
    break;
  case 0x7a:
    uVar8 = (insn & 0x1700000) - 0x100000;
    switch(uVar8 * 0x800 | uVar8 >> 0x15) {
    case 0:
switchD_00641c1e_caseD_0:
      _Var4 = (_Bool)((byte)((uint)uVar2 >> 0xc) & 1);
      goto LAB_00641d03;
    case 2:
switchD_00641c1e_caseD_1:
      if ((~insn & 0xf000) == 0) {
        _Var4 = SUB41(((uint)uVar2 & 0x20) >> 5,0);
        goto LAB_00641d03;
      }
      break;
    case 8:
switchD_00641c1e_caseD_4:
      if ((~insn & 0xf000) == 0) goto switchD_00641c1e_caseD_0;
      break;
    case 10:
switchD_00641c1e_caseD_5:
      _Var4 = (~insn & 0xf000) == 0 && (short)uVar2 < 0;
LAB_00641d03:
      if (_Var4 != false) goto LAB_00641be9;
      break;
    case 0xb:
      switch((insn & 0x8ffff0) - 0xff010 >> 4) {
      case DISAS_NEXT:
        if ((~insn & 0xf) == 0) {
          _Var4 = trans_CLREX((DisasContext_conflict1 *)dcbase,a);
          goto LAB_00641d03;
        }
        break;
      case DISAS_TARGET_0:
      case DISAS_TARGET_1:
        _Var4 = (uVar2 & 0x220) != 0;
        if (_Var4) {
          tcg_gen_mb_aarch64(*(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8),
                             TCG_BAR_SC|TCG_MO_ALL);
          goto LAB_00641be9;
        }
        goto LAB_00641d03;
      case DISAS_TARGET_2:
        _Var4 = (uVar2 & 0x220) != 0;
        if (_Var4) {
          gen_goto_tb((DisasContext_conflict1 *)dcbase,0,dcbase->pc_next);
          goto LAB_00641be9;
        }
        goto LAB_00641d03;
      case DISAS_TARGET_3:
        if ((insn & (DISAS_TARGET_11|DISAS_TOO_MANY)) == DISAS_NEXT) {
          _Var4 = trans_SB((DisasContext_conflict1 *)dcbase,a);
          goto LAB_00641d03;
        }
      }
    }
    break;
  case 0x7b:
    uVar8 = (insn & 0x1700010) - 0x100000;
    switch(uVar8 * 0x400 | uVar8 >> 0x16) {
    case 0:
      goto switchD_00641c1e_caseD_0;
    case 1:
      goto switchD_00641c1e_caseD_1;
    case 4:
      goto switchD_00641c1e_caseD_4;
    case 5:
      goto switchD_00641c1e_caseD_5;
    }
    break;
  case 0x7c:
    if ((insn & 0x50ffe0) == 0x400500) {
      local_38.I = insn >> 0x15 & 1;
      local_38._0_8_ = CONCAT44(insn >> 0x17,insn) & 0x30000001f;
      if ((insn & 0xf0000) == 0xd0000) {
        _Var4 = trans_SRS((DisasContext_conflict1 *)dcbase,(arg_SRS *)&local_38);
        goto LAB_00641d03;
      }
    }
    else if ((insn & 0x50ffe0) == 0x100a00) {
      local_38.I = insn >> 0x15 & 1;
      local_38._0_8_ = CONCAT44(insn >> 0x10,insn >> 0x17) & 0xf00000003;
      if ((insn & 0x1f) == DISAS_NEXT) {
        _Var4 = trans_RFE((DisasContext_conflict1 *)dcbase,(arg_RFE *)&local_38);
        goto LAB_00641d03;
      }
    }
    break;
  case 0x7d:
    local_38.A = ((int)(insn << 8) >> 7 | insn >> 0x18 & 1) * 2;
    _Var4 = trans_BLX_i((DisasContext_conflict1 *)dcbase,(arg_BLX_i *)&local_38);
    goto LAB_00641d03;
  }
  _Var4 = disas_vfp_uncond((DisasContext_conflict1 *)dcbase,insn);
  if (_Var4) goto LAB_00641be9;
  if ((insn & 0xe000000) == 0x2000000) {
    if ((dcbase[4].pc_first & 0x100) != 0) {
      iVar6 = disas_neon_data_insn((DisasContext_conflict1 *)dcbase,insn);
      goto LAB_00641bdd;
    }
  }
  else {
    if ((insn & 0xf100000) == 0x4000000) {
      if ((dcbase[4].pc_first & 0x100) == 0) goto LAB_00641be1;
      iVar6 = disas_neon_ls_insn((DisasContext_conflict1 *)dcbase,insn);
    }
    else if ((insn & 0xe000f00) == 0xc000100) {
      if (((dcbase[4].pc_first & 4) == 0) || ((dcbase[4].num_insns & 2) == 0)) goto LAB_00641be1;
      iVar6 = disas_iwmmxt_insn((DisasContext_conflict1 *)dcbase,insn);
    }
    else if (((insn & 0xe000a00) == 0xc000800) && ((dcbase[4].pc_first & 0x8000000) != 0)) {
      iVar6 = disas_neon_insn_3same_ext((DisasContext_conflict1 *)dcbase,insn);
    }
    else {
      if (((insn & 0xf000a00) != 0xe000800) || ((dcbase[4].pc_first & 0x8000000) == 0))
      goto LAB_00641be1;
      iVar6 = disas_neon_insn_2reg_scalar_ext((DisasContext_conflict1 *)dcbase,insn);
    }
LAB_00641bdd:
    if (iVar6 == 0) goto LAB_00641be9;
  }
LAB_00641be1:
  unallocated_encoding_aarch64((DisasContext_conflict1 *)dcbase);
LAB_00641be9:
  arm_post_translate_insn((DisasContext_conflict1 *)dcbase);
  return;
}

Assistant:

static void arm_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    CPUARMState *env = cpu->env_ptr;
    unsigned int insn;

    if (arm_pre_translate_insn(dc)) {
        return;
    }

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(dc->uc, dcbase->pc_next)) {
        // imitate WFI instruction to halt emulation
        dcbase->is_jmp = DISAS_WFI;
    } else {
        dc->pc_curr = dc->base.pc_next;
        insn = arm_ldl_code(env, dc->base.pc_next, dc->sctlr_b);
        dc->insn = insn;

        // Unicorn:
        //
        // If we get an error during fetching code, we have to skip the instruction decoding
        // to ensure the PC remains unchanged.
        //
        // This is to keep the same behavior with Unicorn1, though, it's inconsistent with
        // official arm documents.
        //
        // See discussion here: https://github.com/unicorn-engine/unicorn/issues/1536
        if (dc->uc->invalid_error) {
            dcbase->is_jmp = DISAS_WFI;
            return;
        }

        dc->base.pc_next += 4;
        disas_arm_insn(dc, insn);

        arm_post_translate_insn(dc);

        /* ARM is a fixed-length ISA.  We performed the cross-page check
           in init_disas_context by adjusting max_insns.  */
    }
}